

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O0

boolean doorlock(obj *otmp,int x,int y)

{
  short sVar1;
  boolean bVar2;
  byte bVar3;
  xchar x_00;
  int iVar4;
  int iVar5;
  rm *loc;
  trap *ptVar6;
  char *pcVar7;
  uint uVar8;
  monst *local_68;
  boolean vis;
  int key;
  char *quickly_dissipates;
  char *dustcloud;
  char *msg;
  int loudness;
  boolean res;
  rm *door;
  int y_local;
  int x_local;
  obj *otmp_local;
  xchar y_00;
  
  loc = level->locations[x] + y;
  msg._7_1_ = '\x01';
  msg._0_4_ = 0;
  dustcloud = (char *)0x0;
  iVar4 = artifact_door(level,x,y);
  if (loc->typ == '\x0f') {
    iVar5 = (int)otmp->otyp;
    if ((1 < iVar5 - 0x186U) && ((iVar5 == 0x18c || ((iVar5 != 0x1c4 && (iVar5 != 0x1cc)))))) {
      return '\0';
    }
    if (iVar4 == 0) {
      loc->typ = '\x17';
      *(uint *)&loc->field_0x6 =
           *(uint *)&loc->field_0x6 & 0xfffffe0f | (*(uint *)&loc->field_0x6 >> 4 & 0x10 | 4) << 4;
    }
    else {
      cvt_sdoor_to_door(loc,&u.uz);
    }
    newsym(x,y);
    if ((viz_array[y][x] & 2U) != 0) {
      pline("A door appears in the wall!");
    }
    if ((otmp->otyp == 0x1cc) || (otmp->otyp == 0x186)) {
      return '\x01';
    }
  }
  sVar1 = otmp->otyp;
  if (sVar1 == 0x186) {
LAB_002016bc:
    if ((iVar4 == 0) && ((*(uint *)&loc->field_0x6 >> 4 & 8) != 0)) {
      dustcloud = "The door unlocks!";
      *(uint *)&loc->field_0x6 =
           *(uint *)&loc->field_0x6 & 0xfffffe0f | (*(uint *)&loc->field_0x6 >> 4 & 0x10 | 4) << 4;
    }
    else {
      msg._7_1_ = '\0';
    }
    goto LAB_002019a9;
  }
  if (sVar1 == 0x187) {
LAB_00201718:
    if ((iVar4 == 0) && ((*(uint *)&loc->field_0x6 >> 4 & 0xc) != 0)) {
      if ((*(uint *)&loc->field_0x6 >> 4 & 0x10) == 0) {
        *(uint *)&loc->field_0x6 = *(uint *)&loc->field_0x6 & 0xfffffe0f | 0x10;
        if (flags.verbose != '\0') {
          if ((viz_array[y][x] & 2U) == 0) {
            if (flags.soundok != '\0') {
              You_hear("a crashing sound.");
            }
          }
          else {
            pline("The door crashes open!");
          }
        }
        unblock_point(x,y);
        newsym(x,y);
        if (vision_full_recalc != '\0') {
          vision_recalc(0);
        }
        msg._0_4_ = 0x14;
      }
      else {
        if ((level->monsters[x][y] == (monst *)0x0) ||
           ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
          if (flags.verbose != '\0') {
            if ((viz_array[y][x] & 2U) == 0) {
              if (flags.soundok != '\0') {
                You_hear("a distant explosion.");
              }
            }
            else {
              pline("KABOOM!!  You see a door explode.");
            }
          }
        }
        else {
          if ((level->monsters[x][y] == (monst *)0x0) ||
             ((*(uint *)&level->monsters[x][y]->field_0x60 >> 9 & 1) != 0)) {
            local_68 = (monst *)0x0;
          }
          else {
            local_68 = level->monsters[x][y];
          }
          mb_trapped(local_68);
        }
        *(uint *)&loc->field_0x6 = *(uint *)&loc->field_0x6 & 0xfffffe0f;
        unblock_point(x,y);
        newsym(x,y);
        msg._0_4_ = 0x28;
      }
    }
    else {
      msg._7_1_ = '\0';
    }
  }
  else {
    if (sVar1 != 0x18c) {
      if (sVar1 == 0x1c4) goto LAB_00201718;
      if (sVar1 == 0x1cc) goto LAB_002016bc;
      if (sVar1 != 0x1cd) {
        warning("magic (%d) attempted on door.",(ulong)(uint)(int)otmp->otyp);
        goto LAB_002019a9;
      }
    }
    bVar2 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
    if (bVar2 != '\0') {
      bVar3 = viz_array[y][x] & 2;
      if (bVar3 == 0) {
        You_hear("a swoosh.");
      }
      else {
        pline("%s springs up in the older, more primitive doorway.","A cloud of dust");
      }
      bVar2 = obstructed(x,y);
      if (bVar2 != '\0') {
        if (bVar3 != 0) {
          pline("The cloud %s.","quickly dissipates");
        }
        return '\0';
      }
      block_point(x,y);
      loc->typ = '\x0f';
      if (bVar3 != 0) {
        pline("The doorway vanishes!");
      }
      newsym(x,y);
      return '\x01';
    }
    bVar2 = obstructed(x,y);
    if (bVar2 != '\0') {
      return '\0';
    }
    ptVar6 = t_at(level,x,y);
    if (ptVar6 != (trap *)0x0) {
      pline("%s springs up in the doorway, but %s.","A cloud of dust","quickly dissipates");
      return '\0';
    }
    switch(*(uint *)&loc->field_0x6 >> 4 & 0xf) {
    case 0:
      dustcloud = "A cloud of dust springs up and assembles itself into a door!";
      break;
    case 1:
      dustcloud = "The broken door reassembles and locks!";
      if (iVar4 != 0) {
        dustcloud = "The broken door reassembles!";
      }
      break;
    case 2:
      dustcloud = "The door swings shut, and locks!";
      if (iVar4 != 0) {
        dustcloud = "The door swings shut!";
      }
      break;
    default:
      msg._7_1_ = '\0';
      break;
    case 4:
      dustcloud = "The door locks!";
      if (iVar4 != 0) {
        dustcloud = "The door closes!";
      }
    }
    block_point(x,y);
    uVar8 = 8;
    if (iVar4 != 0) {
      uVar8 = 4;
    }
    *(uint *)&loc->field_0x6 =
         *(uint *)&loc->field_0x6 & 0xfffffe0f | (uVar8 | *(uint *)&loc->field_0x6 >> 4 & 0x10) << 4
    ;
    newsym(x,y);
  }
LAB_002019a9:
  x_00 = (xchar)x;
  y_00 = (xchar)y;
  if ((dustcloud != (char *)0x0) && ((viz_array[y][x] & 2U) != 0)) {
    pline(dustcloud);
    *(uint *)&level->locations[x][y].field_0x6 =
         *(uint *)&level->locations[x][y].field_0x6 & 0xfffffffe | 1;
    map_background(x_00,y_00,1);
  }
  if ((int)msg != 0) {
    wake_nearto(x,y,(int)msg);
    pcVar7 = in_rooms(level,x_00,y_00,0x12);
    if (*pcVar7 != '\0') {
      add_damage(x_00,y_00,0);
    }
  }
  if ((msg._7_1_ != '\0') && (bVar2 = picking_at(x,y), bVar2 != '\0')) {
    stop_occupation();
    reset_pick();
  }
  return msg._7_1_;
}

Assistant:

boolean doorlock(struct obj *otmp, int x, int y)
{
	struct rm *door = &level->locations[x][y];
	boolean res = TRUE;
	int loudness = 0;
	const char *msg = NULL;
	const char *dustcloud = "A cloud of dust";
	const char *quickly_dissipates = "quickly dissipates";
	int key = artifact_door(level, x, y);	/* ALI - Artifact doors */

	if (door->typ == SDOOR) {
	    switch (otmp->otyp) {
	    case WAN_OPENING:
	    case SPE_KNOCK:
	    case WAN_STRIKING:
	    case SPE_FORCE_BOLT:
		if (key) {
		    /* Artifact doors are revealed only */
		    cvt_sdoor_to_door(door, &u.uz);
		} else {
		    door->typ = DOOR;
		    door->doormask = D_CLOSED | (door->doormask & D_TRAPPED);
		}
		newsym(x,y);
		if (cansee(x,y)) pline("A door appears in the wall!");
		if (otmp->otyp == WAN_OPENING || otmp->otyp == SPE_KNOCK)
		    return TRUE;
		break;		/* striking: continue door handling below */
	    case WAN_LOCKING:
	    case SPE_WIZARD_LOCK:
	    default:
		return FALSE;
	    }
	}

	switch(otmp->otyp) {
	case WAN_LOCKING:
	case SPE_WIZARD_LOCK:
	    if (Is_rogue_level(&u.uz)) {
	    	boolean vis = cansee(x,y);
		/* Can't have real locking in Rogue, so just hide doorway */
		if (vis) pline("%s springs up in the older, more primitive doorway.",
			dustcloud);
		else
			You_hear("a swoosh.");
		if (obstructed(x,y)) {
			if (vis) pline("The cloud %s.",quickly_dissipates);
			return FALSE;
		}
		block_point(x, y);
		door->typ = SDOOR;
		if (vis) pline("The doorway vanishes!");
		newsym(x,y);
		return TRUE;
	    }
	    if (obstructed(x,y)) return FALSE;
	    /* Don't allow doors to close over traps.  This is for pits */
	    /* & trap doors, but is it ever OK for anything else? */
	    if (t_at(level, x, y)) {
		/* maketrap() clears doormask, so it should be NODOOR */
		pline("%s springs up in the doorway, but %s.",
		      dustcloud, quickly_dissipates);
		return FALSE;
	    }

	    switch (door->doormask & ~D_TRAPPED) {
	    case D_CLOSED:
		msg = key ? "The door closes!" :
			    "The door locks!";
		break;
	    case D_ISOPEN:
		msg = key ? "The door swings shut!" :
			    "The door swings shut, and locks!";
		break;
	    case D_BROKEN:
		msg = key ? "The broken door reassembles!" :
			    "The broken door reassembles and locks!";
		break;
	    case D_NODOOR:
		msg =
		"A cloud of dust springs up and assembles itself into a door!";
		break;
	    default:
		res = FALSE;
		break;
	    }
	    block_point(x, y);
	    door->doormask = (key ? D_CLOSED : D_LOCKED) |
			     (door->doormask & D_TRAPPED);
	    newsym(x,y);
	    break;
	case WAN_OPENING:
	case SPE_KNOCK:
	    if (!key && door->doormask & D_LOCKED) {
		msg = "The door unlocks!";
		door->doormask = D_CLOSED | (door->doormask & D_TRAPPED);
	    } else res = FALSE;
	    break;
	case WAN_STRIKING:
	case SPE_FORCE_BOLT:
	    if (!key && door->doormask & (D_LOCKED | D_CLOSED)) {
		if (door->doormask & D_TRAPPED) {
		    if (MON_AT(level, x, y))
			mb_trapped(m_at(level, x,y));
		    else if (flags.verbose) {
			if (cansee(x,y))
			    pline("KABOOM!!  You see a door explode.");
			else if (flags.soundok)
			    You_hear("a distant explosion.");
		    }
		    door->doormask = D_NODOOR;
		    unblock_point(x,y);
		    newsym(x,y);
		    loudness = 40;
		    break;
		}
		door->doormask = D_BROKEN;
		if (flags.verbose) {
		    if (cansee(x,y))
			pline("The door crashes open!");
		    else if (flags.soundok)
			You_hear("a crashing sound.");
		}
		unblock_point(x,y);
		newsym(x,y);
		/* force vision recalc before printing more messages */
		if (vision_full_recalc) vision_recalc(0);
		loudness = 20;
	    } else res = FALSE;
	    break;
	default: warning("magic (%d) attempted on door.", otmp->otyp);
	    break;
	}
	if (msg && cansee(x,y)) {
	    pline(msg);
	    /* we know whether it's locked now */
	    level->locations[x][y].mem_door_l = 1;
	    map_background(x, y, TRUE);
	}
	if (loudness > 0) {
	    /* door was destroyed */
	    wake_nearto(x, y, loudness);
	    if (*in_rooms(level, x, y, SHOPBASE)) add_damage(x, y, 0L);
	}

	if (res && picking_at(x, y)) {
	    /* maybe unseen monster zaps door you're unlocking */
	    stop_occupation();
	    reset_pick();
	}
	return res;
}